

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dense.cpp
# Opt level: O3

void __thiscall
Dense::Dense(Dense *this,int input_size,int output_size,double *nlearning_rate,string *ntype)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double *pdVar2;
  long lVar3;
  undefined1 auVar4 [16];
  result_type_conflict1 rVar5;
  double dVar6;
  Index IVar7;
  Index IVar8;
  uint uVar9;
  undefined8 *puVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  undefined4 in_register_00000034;
  long lVar14;
  default_random_engine generator;
  normal_distribution<double> local_98;
  string *local_78;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_70;
  DenseStorage<double,__1,__1,__1,_0> local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  double *local_48;
  string *local_40;
  long local_38;
  
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR_forward_00117d30;
  paVar1 = &(this->type).field_2;
  (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = (double *)0x0;
  (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = 0;
  (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
       = 0;
  (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  (this->activation).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->activation).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->activation).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  (this->last_input).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_data = (double *)0x0;
  (this->last_input).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_rows = 0;
  (this->last_input).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
  m_cols = 0;
  (this->type)._M_dataplus._M_p = (pointer)paVar1;
  (this->type)._M_string_length = 0;
  (this->type).field_2._M_local_buf[0] = '\0';
  local_98._M_saved = 0.0;
  local_98._M_param._M_mean = 0.0;
  local_98._M_param._M_stddev = 0.0;
  lVar14 = (long)input_size;
  lVar12 = (long)output_size;
  local_48 = nlearning_rate;
  local_40 = ntype;
  if (-1 < (output_size | input_size)) {
    local_78 = (string *)&this->type;
    local_50 = paVar1;
    if ((output_size != 0 && input_size != 0) &&
       (auVar4 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
       SUB168(auVar4 / SEXT816(lVar12),0) < lVar14)) {
      puVar10 = (undefined8 *)
                __cxa_allocate_exception
                          (8,CONCAT44(in_register_00000034,input_size),
                           SUB168(auVar4 % SEXT816(lVar12),0));
      *puVar10 = operator_new;
      __cxa_throw(puVar10,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_38 = lVar12;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_98,lVar12 * lVar14,lVar14,lVar12);
    pdVar2 = (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_98._M_param._M_mean;
    dVar6 = (double)(this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    .m_storage.m_rows;
    rVar5 = (result_type_conflict1)
            (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = (Index)local_98._M_param._M_stddev;
    (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = (Index)local_98._M_saved;
    local_98._M_param._M_mean = (double)pdVar2;
    local_98._M_param._M_stddev = dVar6;
    local_98._M_saved = rVar5;
    free(pdVar2);
    uVar9 = std::chrono::_V2::system_clock::now();
    uVar11 = uVar9 / 0x7fffffff << 0x1f | uVar9 / 0x7fffffff;
    local_70._M_x = (unsigned_long)(uVar11 + uVar9 + (uint)(uVar9 + uVar11 == 0));
    local_98._M_param._M_mean = 0.0;
    local_98._M_param._M_stddev = 1.0;
    local_98._M_saved = 0.0;
    local_98._M_saved_available = false;
    lVar12 = (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    if (0 < lVar12) {
      lVar14 = (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_cols;
      lVar13 = 0;
      do {
        if (0 < lVar14) {
          lVar12 = 0;
          do {
            rVar5 = std::normal_distribution<double>::operator()
                              (&local_98,&local_70,&local_98._M_param);
            lVar3 = (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                    .m_storage.m_rows;
            if ((lVar3 <= lVar13) ||
               (lVar14 = (this->weigths).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_cols, lVar14 <= lVar12)) goto LAB_00108db8;
            (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_data[lVar3 * lVar12 + lVar13] = rVar5;
            lVar12 = lVar12 + 1;
          } while (lVar12 < lVar14);
          lVar12 = (this->weigths).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < lVar12);
    }
    local_68.m_data = (double *)0x0;
    local_68.m_rows = 0;
    local_68.m_cols = 0;
    if (-1 < output_size) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_68,local_38,1,local_38);
      pdVar2 = (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_data;
      (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_data = local_68.m_data;
      IVar7 = (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_rows;
      IVar8 = (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols;
      (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_rows = local_68.m_rows;
      (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
      m_cols = local_68.m_cols;
      local_68.m_data = pdVar2;
      local_68.m_rows = IVar7;
      local_68.m_cols = IVar8;
      free(pdVar2);
      if (0 < (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_cols) {
        lVar12 = 0;
        do {
          rVar5 = std::normal_distribution<double>::operator()
                            (&local_98,&local_70,&local_98._M_param);
          lVar14 = (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_rows;
          if ((lVar14 < 1) ||
             (lVar13 = (this->biases).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols, lVar13 <= lVar12)) {
LAB_00108db8:
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x16d,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                         );
          }
          (this->biases).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data[lVar14 * lVar12] = rVar5;
          lVar12 = lVar12 + 1;
        } while (lVar12 < lVar13);
      }
      this->learning_rate = local_48;
      std::__cxx11::string::_M_assign(local_78);
      return;
    }
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/PlainObjectBase.h"
                ,0x11d,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
               );
}

Assistant:

Dense::Dense(int input_size, int output_size, double* nlearning_rate, string ntype) {
    weigths = Eigen::MatrixXd(input_size, output_size);
    unsigned seed = std::chrono::system_clock::now().time_since_epoch().count();
    std::default_random_engine generator (seed);
    std::normal_distribution<double> distribution(0.0,1.0);
    for(int i = 0; i < weigths.rows(); i++) {
        for(int j = 0; j < weigths.cols(); j++) {
            weigths(i,j) = distribution(generator);
        }
    }
    biases = Eigen::MatrixXd(1, output_size);
    for(int i = 0; i < biases.cols(); i++) {
        biases(0,i) = distribution(generator);
    }
    learning_rate = nlearning_rate;
    type = ntype;
}